

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vmstd.hpp
# Opt level: O0

void __thiscall squall::VMStd::dofile(VMStd *this,SQChar *filename)

{
  HSQUIRRELVM v;
  SQRESULT SVar1;
  squirrel_error *this_00;
  SQBool in_stack_ffffffffffffff98;
  SQChar *in_stack_ffffffffffffffa0;
  HSQUIRRELVM in_stack_ffffffffffffffa8;
  undefined1 local_28 [8];
  keeper k;
  SQChar *filename_local;
  VMStd *this_local;
  
  k.top = (SQInteger)filename;
  v = VM::handle(&this->super_VM);
  keeper::keeper((keeper *)local_28,v);
  VM::handle(&this->super_VM);
  sq_pushroottable((HSQUIRRELVM)0x106d51);
  VM::handle(&this->super_VM);
  SVar1 = sqstd_dofile(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                       ,0x106d78);
  if (SVar1 < 0) {
    this_00 = (squirrel_error *)__cxa_allocate_exception(0x10);
    squirrel_error::runtime_error(this_00,"dofile failed");
    __cxa_throw(this_00,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  keeper::~keeper((keeper *)local_28);
  return;
}

Assistant:

void dofile(const SQChar* filename) {
        keeper k(handle());
        sq_pushroottable(handle());
        if (!SQ_SUCCEEDED(sqstd_dofile(handle(), filename, 0, 1))) {
            throw squirrel_error("dofile failed");
        }
    }